

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

void http_rd_start(nni_http_conn *conn)

{
  uint8_t *__dest;
  nni_iov *pnVar1;
  bool bVar2;
  nng_err result;
  nni_aio *aio;
  nni_http_chunks *cl;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  nng_http_status status;
  uint nio_00;
  nni_iov *pnVar8;
  uint8_t *puVar9;
  undefined1 local_68 [8];
  nni_iov iov1;
  nni_iov *local_48;
  nni_iov *iov;
  uint local_34 [2];
  uint nio;
  
  iov1.iov_len = (size_t)&conn->rd_get;
  do {
    while( true ) {
      aio = conn->rd_uaio;
      if (aio == (nni_aio *)0x0) {
        aio = (nni_aio *)nni_list_first(&conn->rdq);
        if (aio == (nni_aio *)0x0) {
          return;
        }
        nni_list_remove(&conn->rdq,aio);
        conn->rd_uaio = aio;
      }
      result = NNG_ECLOSED;
      if (conn->closed == false) break;
LAB_00134d61:
      conn->rd_uaio = (nni_aio *)0x0;
      nni_aio_finish_error(aio,result);
      http_close(conn);
    }
    if (HTTP_RD_DISCARD < conn->rd_flavor) {
      result = NNG_EINVAL;
      goto LAB_00134d61;
    }
    sVar4 = conn->rd_get;
    sVar7 = conn->rd_put;
    pnVar8 = (nni_iov *)(sVar7 - sVar4);
    __dest = conn->buf;
    puVar9 = __dest + sVar4;
    switch(conn->rd_flavor) {
    case HTTP_RD_RAW:
      bVar2 = true;
      break;
    case HTTP_RD_FULL:
      bVar2 = false;
      break;
    case HTTP_RD_REQ:
      conn->client = true;
      result = nni_http_req_parse(conn,puVar9,(size_t)pnVar8,(size_t *)&iov);
      conn->client = false;
      sVar4 = (long)&iov->iov_buf + conn->rd_get;
      sVar5 = conn->rd_put;
      conn->rd_get = sVar4;
      if (sVar5 - sVar4 == 0) {
        *(undefined8 *)iov1.iov_len = 0;
        *(undefined8 *)(iov1.iov_len + 8) = 0;
        if (result != NNG_EAGAIN) goto LAB_00135091;
        sVar5 = 0;
      }
      else {
        if (result != NNG_EAGAIN) goto LAB_00135091;
        if (sVar4 != 0) {
          memmove(conn->buf,conn->buf + sVar4,sVar5 - sVar4);
          sVar5 = conn->rd_put - conn->rd_get;
          conn->rd_put = sVar5;
          conn->rd_get = 0;
        }
      }
      sVar6 = conn->bufsz;
      if (sVar5 == sVar6) {
        status = NNG_HTTP_STATUS_URI_TOO_LONG;
        if ((conn->req).data.parsed != false) {
          status = NNG_HTTP_STATUS_HEADERS_TOO_LARGE;
        }
        nng_http_set_status(conn,status,(char *)0x0);
        builtin_memcpy(conn->buf,"NNG-DISCARD: X",0xf);
        conn->rd_get = 0;
        puVar9 = conn->buf;
        sVar5 = strlen((char *)puVar9);
        conn->rd_put = sVar5;
        sVar6 = conn->bufsz;
      }
      else {
        puVar9 = conn->buf;
      }
      local_68 = (undefined1  [8])(puVar9 + sVar5);
      goto LAB_001351fb;
    case HTTP_RD_RES:
      conn->client = false;
      result = nni_http_res_parse(conn,puVar9,(size_t)pnVar8,(size_t *)&iov);
      conn->client = true;
      sVar7 = (long)&iov->iov_buf + conn->rd_get;
      sVar4 = conn->rd_put;
      conn->rd_get = sVar7;
      if (sVar4 - sVar7 != 0) {
        if (result == NNG_EAGAIN) {
          if (sVar7 != 0) {
            memmove(conn->buf,conn->buf + sVar7,sVar4 - sVar7);
            sVar4 = conn->rd_put - conn->rd_get;
            conn->rd_put = sVar4;
            conn->rd_get = 0;
          }
          goto LAB_0013505e;
        }
LAB_00135091:
        if (result != NNG_OK) goto LAB_00134d61;
        goto LAB_00135099;
      }
      *(undefined8 *)iov1.iov_len = 0;
      *(undefined8 *)(iov1.iov_len + 8) = 0;
      if (result != NNG_EAGAIN) goto LAB_00135091;
      sVar4 = 0;
LAB_0013505e:
      local_68 = (undefined1  [8])(conn->buf + sVar4);
      iov1.iov_buf = (void *)(conn->bufsz - sVar4);
      conn->buffered = true;
      if (iov1.iov_buf == (void *)0x0) {
        result = NNG_EMSGSIZE;
        goto LAB_00134d61;
      }
      goto LAB_0013520d;
    case HTTP_RD_CHUNK:
      cl = (nni_http_chunks *)nni_aio_get_prov_data(aio);
      result = nni_http_chunks_parse(cl,puVar9,(size_t)pnVar8,(size_t *)&iov);
      sVar5 = conn->rd_put;
      sVar6 = (long)&iov->iov_buf + conn->rd_get;
      conn->rd_get = sVar6;
      if (sVar6 == sVar5) {
        *(undefined8 *)iov1.iov_len = 0;
        *(undefined8 *)(iov1.iov_len + 8) = 0;
        sVar5 = 0;
      }
      if (result != NNG_EAGAIN) goto LAB_00135091;
      local_68 = (undefined1  [8])(conn->buf + sVar5);
      sVar6 = conn->bufsz;
LAB_001351fb:
      iov1.iov_buf = (void *)(sVar6 - sVar5);
      conn->buffered = true;
LAB_0013520d:
      pnVar8 = (nni_iov *)local_68;
      nio_00 = 1;
      goto LAB_00135215;
    case HTTP_RD_DISCARD:
      pnVar1 = (nni_iov *)conn->rd_discard;
      iov = pnVar8;
      if (pnVar1 <= pnVar8) {
        iov = pnVar1;
      }
      sVar3 = (long)pnVar1 - (long)iov;
      sVar4 = (long)&iov->iov_buf + sVar4;
      conn->rd_get = sVar4;
      conn->rd_discard = sVar3;
      if (sVar4 != 0) {
        memmove(__dest,__dest + sVar4,sVar7 - sVar4);
        sVar3 = conn->rd_discard;
        sVar7 = conn->rd_put - conn->rd_get;
        conn->rd_put = sVar7;
        conn->rd_get = 0;
      }
      if (sVar3 == 0) goto LAB_00135099;
      local_68 = (undefined1  [8])(conn->buf + sVar7);
      iov1.iov_buf = (void *)(conn->bufsz - sVar7);
      conn->buffered = true;
      pnVar8 = (nni_iov *)local_68;
      nio_00 = 1;
LAB_00135215:
      nni_aio_set_iov(&conn->rd_aio,nio_00,pnVar8);
      nng_stream_recv(conn->sock,&conn->rd_aio);
      return;
    }
    nni_aio_get_iov(aio,local_34,&local_48);
    if (pnVar8 != (nni_iov *)0x0 && local_34[0] != 0) {
      do {
        iov = (nni_iov *)local_48->iov_len;
        if (pnVar8 <= (nni_iov *)local_48->iov_len) {
          iov = pnVar8;
        }
        memcpy(local_48->iov_buf,puVar9,(size_t)iov);
        pnVar1 = iov;
        local_48->iov_len = local_48->iov_len - (long)iov;
        local_48->iov_buf = (void *)((long)&iov->iov_buf + (long)local_48->iov_buf);
        *(long *)iov1.iov_len = (long)&iov->iov_buf + *(long *)iov1.iov_len;
        nni_aio_bump_count(aio,(size_t)iov);
        if (local_48->iov_len == 0) {
          local_34[0] = local_34[0] - 1;
          local_48 = local_48 + 1;
        }
        if (local_34[0] == 0) break;
        puVar9 = puVar9 + (long)pnVar1;
        pnVar8 = (nni_iov *)((long)pnVar8 - (long)iov);
      } while (pnVar8 != (nni_iov *)0x0);
    }
    nni_aio_set_iov(aio,local_34[0],local_48);
    if ((local_34[0] != 0) && ((!bVar2 || (sVar4 = nni_aio_count(aio), sVar4 == 0)))) {
      conn->buffered = false;
      pnVar8 = local_48;
      nio_00 = local_34[0];
      goto LAB_00135215;
    }
LAB_00135099:
    conn->rd_uaio = (nni_aio *)0x0;
    sVar4 = nni_aio_count(aio);
    nni_aio_finish(aio,NNG_OK,sVar4);
  } while( true );
}

Assistant:

static void
http_rd_start(nni_http_conn *conn)
{
	for (;;) {
		nni_aio *aio;
		int      rv;

		if ((aio = conn->rd_uaio) == NULL) {
			if ((aio = nni_list_first(&conn->rdq)) == NULL) {
				// No more stuff waiting for read.
				return;
			}
			nni_list_remove(&conn->rdq, aio);
			conn->rd_uaio = aio;
		}

		if (conn->closed) {
			rv = NNG_ECLOSED;
		} else {
			rv = http_rd_buf(conn, aio);
		}
		switch (rv) {
		case NNG_EAGAIN:
			return;
		case 0:
			conn->rd_uaio = NULL;
			nni_aio_finish(aio, NNG_OK, nni_aio_count(aio));
			break;
		default:
			conn->rd_uaio = NULL;
			nni_aio_finish_error(aio, rv);
			http_close(conn);
			break;
		}
	}
}